

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void * body(MD5_CTX *ctx,void *data,unsigned_long size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  MD5_u32plus saved_d;
  MD5_u32plus saved_c;
  MD5_u32plus saved_b;
  MD5_u32plus saved_a;
  MD5_u32plus d;
  MD5_u32plus c;
  MD5_u32plus b;
  MD5_u32plus a;
  uchar *ptr;
  unsigned_long size_local;
  void *data_local;
  MD5_CTX *ctx_local;
  
  c = ctx->a;
  d = ctx->b;
  saved_a = ctx->c;
  saved_b = ctx->d;
  _b = (int *)data;
  ptr = (uchar *)size;
  do {
    uVar1 = (saved_b ^ d & (saved_a ^ saved_b)) + *_b + -0x28955b88 + c;
    uVar2 = d + (uVar1 * 0x80 | uVar1 >> 0x19);
    uVar1 = (saved_a ^ uVar2 & (d ^ saved_a)) + _b[1] + -0x173848aa + saved_b;
    uVar3 = uVar2 + (uVar1 * 0x1000 | uVar1 >> 0x14);
    uVar1 = (d ^ uVar3 & (uVar2 ^ d)) + _b[2] + 0x242070db + saved_a;
    uVar4 = uVar3 + (uVar1 * 0x20000 | uVar1 >> 0xf);
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[3] + -0x3e423112 + d;
    uVar1 = uVar4 + (uVar1 * 0x400000 | uVar1 >> 10);
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + _b[4] + -0xa83f051 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x80 | uVar2 >> 0x19);
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + _b[5] + 0x4787c62a + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x1000 | uVar3 >> 0x14);
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + _b[6] + -0x57cfb9ed + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x20000 | uVar4 >> 0xf);
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[7] + -0x2b96aff + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x400000 | uVar1 >> 10);
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + _b[8] + 0x698098d8 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x80 | uVar2 >> 0x19);
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + _b[9] + -0x74bb0851 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x1000 | uVar3 >> 0x14);
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + _b[10] + -0xa44f + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x20000 | uVar4 >> 0xf);
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[0xb] + -0x76a32842 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x400000 | uVar1 >> 10);
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + _b[0xc] + 0x6b901122 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x80 | uVar2 >> 0x19);
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + _b[0xd] + -0x2678e6d + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x1000 | uVar3 >> 0x14);
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + _b[0xe] + -0x5986bc72 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x20000 | uVar4 >> 0xf);
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[0xf] + 0x49b40821 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x400000 | uVar1 >> 10);
    uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + _b[1] + -0x9e1da9e + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x20 | uVar2 >> 0x1b);
    uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + _b[6] + -0x3fbf4cc0 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x200 | uVar3 >> 0x17);
    uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + _b[0xb] + 0x265e5a51 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x4000 | uVar4 >> 0x12);
    uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + *_b + -0x16493856 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x100000 | uVar1 >> 0xc);
    uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + _b[5] + -0x29d0efa3 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x20 | uVar2 >> 0x1b);
    uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + _b[10] + 0x2441453 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x200 | uVar3 >> 0x17);
    uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + _b[0xf] + -0x275e197f + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x4000 | uVar4 >> 0x12);
    uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + _b[4] + -0x182c0438 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x100000 | uVar1 >> 0xc);
    uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + _b[9] + 0x21e1cde6 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x20 | uVar2 >> 0x1b);
    uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + _b[0xe] + -0x3cc8f82a + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x200 | uVar3 >> 0x17);
    uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + _b[3] + -0xb2af279 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x4000 | uVar4 >> 0x12);
    uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + _b[8] + 0x455a14ed + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x100000 | uVar1 >> 0xc);
    uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + _b[0xd] + -0x561c16fb + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x20 | uVar2 >> 0x1b);
    uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + _b[2] + -0x3105c08 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x200 | uVar3 >> 0x17);
    uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + _b[7] + 0x676f02d9 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x4000 | uVar4 >> 0x12);
    uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + _b[0xc] + -0x72d5b376 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x100000 | uVar1 >> 0xc);
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + _b[5] + -0x5c6be + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + _b[8] + -0x788e097f + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x800 | uVar3 >> 0x15);
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[0xb] + 0x6d9d6122 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x10000 | uVar4 >> 0x10);
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[0xe] + -0x21ac7f4 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x800000 | uVar1 >> 9);
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + _b[1] + -0x5b4115bc + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + _b[4] + 0x4bdecfa9 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x800 | uVar3 >> 0x15);
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[7] + -0x944b4a0 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x10000 | uVar4 >> 0x10);
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[10] + -0x41404390 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x800000 | uVar1 >> 9);
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + _b[0xd] + 0x289b7ec6 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + *_b + -0x155ed806 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x800 | uVar3 >> 0x15);
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[3] + -0x2b10cf7b + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x10000 | uVar4 >> 0x10);
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[6] + 0x4881d05 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x800000 | uVar1 >> 9);
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + _b[9] + -0x262b2fc7 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + _b[0xc] + -0x1924661b + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x800 | uVar3 >> 0x15);
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[0xf] + 0x1fa27cf8 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x10000 | uVar4 >> 0x10);
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[2] + -0x3b53a99b + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x800000 | uVar1 >> 9);
    uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + *_b + -0xbd6ddbc + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x40 | uVar2 >> 0x1a);
    uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + _b[7] + 0x432aff97 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x400 | uVar3 >> 0x16);
    uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + _b[0xe] + -0x546bdc59 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x8000 | uVar4 >> 0x11);
    uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + _b[5] + -0x36c5fc7 + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x200000 | uVar1 >> 0xb);
    uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + _b[0xc] + 0x655b59c3 + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x40 | uVar2 >> 0x1a);
    uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + _b[3] + -0x70f3336e + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x400 | uVar3 >> 0x16);
    uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + _b[10] + -0x100b83 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x8000 | uVar4 >> 0x11);
    uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + _b[1] + -0x7a7ba22f + uVar1;
    uVar1 = uVar4 + (uVar1 * 0x200000 | uVar1 >> 0xb);
    uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + _b[8] + 0x6fa87e4f + uVar2;
    uVar2 = uVar1 + (uVar2 * 0x40 | uVar2 >> 0x1a);
    uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + _b[0xf] + -0x1d31920 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x400 | uVar3 >> 0x16);
    uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + _b[6] + -0x5cfebcec + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x8000 | uVar4 >> 0x11);
    uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + _b[0xd] + 0x4e0811a1 + uVar1;
    uVar5 = uVar4 + (uVar1 * 0x200000 | uVar1 >> 0xb);
    uVar2 = (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + _b[4] + -0x8ac817e + uVar2;
    uVar1 = uVar5 + (uVar2 * 0x40 | uVar2 >> 0x1a);
    uVar3 = (uVar5 ^ (uVar1 | uVar4 ^ 0xffffffff)) + _b[0xb] + -0x42c50dcb + uVar3;
    uVar2 = uVar1 + (uVar3 * 0x400 | uVar3 >> 0x16);
    uVar4 = (uVar1 ^ (uVar2 | uVar5 ^ 0xffffffff)) + _b[2] + 0x2ad7d2bb + uVar4;
    uVar3 = uVar2 + (uVar4 * 0x8000 | uVar4 >> 0x11);
    uVar5 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + _b[9] + -0x14792c6f + uVar5;
    c = c + uVar1;
    d = d + uVar3 + (uVar5 * 0x200000 | uVar5 >> 0xb);
    saved_a = saved_a + uVar3;
    saved_b = saved_b + uVar2;
    _b = _b + 0x10;
    ptr = ptr + -0x40;
  } while (ptr != (uchar *)0x0);
  ctx->a = c;
  ctx->b = d;
  ctx->c = saved_a;
  ctx->d = saved_b;
  return _b;
}

Assistant:

static const void *body(MD5_CTX *ctx, const void *data, unsigned long size)
{
  const unsigned char *ptr;
  MD5_u32plus a, b, c, d;
  MD5_u32plus saved_a, saved_b, saved_c, saved_d;

  ptr = (const unsigned char *)data;

  a = ctx->a;
  b = ctx->b;
  c = ctx->c;
  d = ctx->d;

  do {
    saved_a = a;
    saved_b = b;
    saved_c = c;
    saved_d = d;

/* Round 1 */
    STEP(F, a, b, c, d, SET(0), 0xd76aa478, 7)
      STEP(F, d, a, b, c, SET(1), 0xe8c7b756, 12)
      STEP(F, c, d, a, b, SET(2), 0x242070db, 17)
      STEP(F, b, c, d, a, SET(3), 0xc1bdceee, 22)
      STEP(F, a, b, c, d, SET(4), 0xf57c0faf, 7)
      STEP(F, d, a, b, c, SET(5), 0x4787c62a, 12)
      STEP(F, c, d, a, b, SET(6), 0xa8304613, 17)
      STEP(F, b, c, d, a, SET(7), 0xfd469501, 22)
      STEP(F, a, b, c, d, SET(8), 0x698098d8, 7)
      STEP(F, d, a, b, c, SET(9), 0x8b44f7af, 12)
      STEP(F, c, d, a, b, SET(10), 0xffff5bb1, 17)
      STEP(F, b, c, d, a, SET(11), 0x895cd7be, 22)
      STEP(F, a, b, c, d, SET(12), 0x6b901122, 7)
      STEP(F, d, a, b, c, SET(13), 0xfd987193, 12)
      STEP(F, c, d, a, b, SET(14), 0xa679438e, 17)
      STEP(F, b, c, d, a, SET(15), 0x49b40821, 22)

/* Round 2 */
      STEP(G, a, b, c, d, GET(1), 0xf61e2562, 5)
      STEP(G, d, a, b, c, GET(6), 0xc040b340, 9)
      STEP(G, c, d, a, b, GET(11), 0x265e5a51, 14)
      STEP(G, b, c, d, a, GET(0), 0xe9b6c7aa, 20)
      STEP(G, a, b, c, d, GET(5), 0xd62f105d, 5)
      STEP(G, d, a, b, c, GET(10), 0x02441453, 9)
      STEP(G, c, d, a, b, GET(15), 0xd8a1e681, 14)
      STEP(G, b, c, d, a, GET(4), 0xe7d3fbc8, 20)
      STEP(G, a, b, c, d, GET(9), 0x21e1cde6, 5)
      STEP(G, d, a, b, c, GET(14), 0xc33707d6, 9)
      STEP(G, c, d, a, b, GET(3), 0xf4d50d87, 14)
      STEP(G, b, c, d, a, GET(8), 0x455a14ed, 20)
      STEP(G, a, b, c, d, GET(13), 0xa9e3e905, 5)
      STEP(G, d, a, b, c, GET(2), 0xfcefa3f8, 9)
      STEP(G, c, d, a, b, GET(7), 0x676f02d9, 14)
      STEP(G, b, c, d, a, GET(12), 0x8d2a4c8a, 20)

/* Round 3 */
      STEP(H, a, b, c, d, GET(5), 0xfffa3942, 4)
      STEP(H2, d, a, b, c, GET(8), 0x8771f681, 11)
      STEP(H, c, d, a, b, GET(11), 0x6d9d6122, 16)
      STEP(H2, b, c, d, a, GET(14), 0xfde5380c, 23)
      STEP(H, a, b, c, d, GET(1), 0xa4beea44, 4)
      STEP(H2, d, a, b, c, GET(4), 0x4bdecfa9, 11)
      STEP(H, c, d, a, b, GET(7), 0xf6bb4b60, 16)
      STEP(H2, b, c, d, a, GET(10), 0xbebfbc70, 23)
      STEP(H, a, b, c, d, GET(13), 0x289b7ec6, 4)
      STEP(H2, d, a, b, c, GET(0), 0xeaa127fa, 11)
      STEP(H, c, d, a, b, GET(3), 0xd4ef3085, 16)
      STEP(H2, b, c, d, a, GET(6), 0x04881d05, 23)
      STEP(H, a, b, c, d, GET(9), 0xd9d4d039, 4)
      STEP(H2, d, a, b, c, GET(12), 0xe6db99e5, 11)
      STEP(H, c, d, a, b, GET(15), 0x1fa27cf8, 16)
      STEP(H2, b, c, d, a, GET(2), 0xc4ac5665, 23)

/* Round 4 */
      STEP(I, a, b, c, d, GET(0), 0xf4292244, 6)
      STEP(I, d, a, b, c, GET(7), 0x432aff97, 10)
      STEP(I, c, d, a, b, GET(14), 0xab9423a7, 15)
      STEP(I, b, c, d, a, GET(5), 0xfc93a039, 21)
      STEP(I, a, b, c, d, GET(12), 0x655b59c3, 6)
      STEP(I, d, a, b, c, GET(3), 0x8f0ccc92, 10)
      STEP(I, c, d, a, b, GET(10), 0xffeff47d, 15)
      STEP(I, b, c, d, a, GET(1), 0x85845dd1, 21)
      STEP(I, a, b, c, d, GET(8), 0x6fa87e4f, 6)
      STEP(I, d, a, b, c, GET(15), 0xfe2ce6e0, 10)
      STEP(I, c, d, a, b, GET(6), 0xa3014314, 15)
      STEP(I, b, c, d, a, GET(13), 0x4e0811a1, 21)
      STEP(I, a, b, c, d, GET(4), 0xf7537e82, 6)
      STEP(I, d, a, b, c, GET(11), 0xbd3af235, 10)
      STEP(I, c, d, a, b, GET(2), 0x2ad7d2bb, 15)
      STEP(I, b, c, d, a, GET(9), 0xeb86d391, 21)

      a += saved_a;
    b += saved_b;
    c += saved_c;
    d += saved_d;

    ptr += 64;
  } while(size -= 64);

  ctx->a = a;
  ctx->b = b;
  ctx->c = c;
  ctx->d = d;

  return ptr;
}